

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRawRepeatedField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpptype,
          int ctype,Descriptor *desc)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  FieldOptions_CType FVar4;
  int number;
  Type TVar5;
  FieldOptions *this_00;
  Descriptor *pDVar6;
  LogMessage *pLVar7;
  ExtensionSet *this_01;
  MapFieldBase *this_02;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Descriptor *local_38;
  Descriptor *desc_local;
  int ctype_local;
  CppType cpptype_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  local_38 = desc;
  desc_local._0_4_ = ctype;
  desc_local._4_4_ = cpptype;
  _ctype_local = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,_ctype_local,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(_ctype_local);
  if (CVar3 != desc_local._4_4_) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,_ctype_local,"MutableRawRepeatedField",desc_local._4_4_);
  }
  if (-1 < (int)(FieldOptions_CType)desc_local) {
    this_00 = FieldDescriptor::options(_ctype_local);
    FVar4 = FieldOptions::ctype(this_00);
    local_71 = 0;
    if (FVar4 != (FieldOptions_CType)desc_local) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x6ae);
      local_71 = 1;
      pLVar7 = LogMessage::operator<<
                         (&local_70,"CHECK failed: (field->options().ctype()) == (ctype): ");
      pLVar7 = LogMessage::operator<<(pLVar7,"subtype mismatch");
      LogFinisher::operator=(local_85,pLVar7);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
  }
  if (local_38 != (Descriptor *)0x0) {
    pDVar6 = FieldDescriptor::message_type(_ctype_local);
    local_c1 = 0;
    if (pDVar6 != local_38) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x6b0);
      local_c1 = 1;
      pLVar7 = LogMessage::operator<<(&local_c0,"CHECK failed: (field->message_type()) == (desc): ")
      ;
      pLVar7 = LogMessage::operator<<(pLVar7,"wrong submessage type");
      LogFinisher::operator=(&local_c2,pLVar7);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
  }
  bVar1 = FieldDescriptor::is_extension(_ctype_local);
  if (bVar1) {
    this_01 = MutableExtensionSet(this,(Message *)field_local);
    number = FieldDescriptor::number(_ctype_local);
    TVar5 = FieldDescriptor::type(_ctype_local);
    bVar1 = FieldDescriptor::is_packed(_ctype_local);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::MutableRawRepeatedField
                           (this_01,number,(FieldType)TVar5,bVar1,_ctype_local);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi(_ctype_local);
    if (bVar1) {
      this_02 = MutableRawNonOneof<google::protobuf::internal::MapFieldBase>
                          (this,(Message *)field_local,_ctype_local);
      this_local = (GeneratedMessageReflection *)MapFieldBase::MutableRepeatedField(this_02);
    }
    else {
      this_local = (GeneratedMessageReflection *)
                   MutableRawNonOneof<void>(this,(Message *)field_local,_ctype_local);
    }
  }
  return this_local;
}

Assistant:

void* GeneratedMessageReflection::MutableRawRepeatedField(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpptype,
    int ctype, const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_,
        field, "MutableRawRepeatedField", cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != NULL)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}